

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O2

uint32_t __thiscall
PolygonTriangulation::search_trapezoid_index(PolygonTriangulation *this,vertex_t *v,QNode_t *node)

{
  QNodeType_t QVar1;
  bool bVar2;
  uint32_t uVar3;
  long lVar4;
  double dVar5;
  
  do {
    if (node == (QNode_t *)0x0) {
      __assert_fail("nullptr != node",
                    "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/src/trapezoidal_decomposition.cc"
                    ,0x70,
                    "uint32_t PolygonTriangulation::search_trapezoid_index(const vertex_t &, const QNode_t *)"
                   );
    }
    QVar1 = node->type;
    if (QVar1 == X_NODE) {
      dVar5 = distance_from_segment
                        (this,v,(this->segments_).
                                super__Vector_base<segment_t,_std::allocator<segment_t>_>._M_impl.
                                super__Vector_impl_data._M_start + node->key_index);
      lVar4 = 0x10;
      if (dVar5 <= 0.0) {
        lVar4 = 8;
      }
    }
    else {
      if (QVar1 != Y_NODE) {
        if (QVar1 == SINK) {
          uVar3 = node->key_index;
        }
        else {
          uVar3 = 0xffffffff;
        }
        return uVar3;
      }
      bVar2 = anon_unknown.dwarf_16e84::is_vertex_lower(v,this->vertices_ + node->key_index);
      lVar4 = (ulong)!bVar2 * 8 + 8;
    }
    node = *(QNode_t **)((long)&node->type + lVar4);
  } while( true );
}

Assistant:

uint32_t PolygonTriangulation::search_trapezoid_index(const vertex_t &v, const QNode_t *node)
{
  assert(nullptr != node);
  switch (node->type) {
    case X_NODE: {
      return (distance_from_segment(v, segments_[node->key_index]) <= 0.0) ?
            search_trapezoid_index(v, node->left)  :
            search_trapezoid_index(v, node->right) ;
    }

    case Y_NODE: {
      return is_vertex_lower(v, vertices_[node->key_index]) ?
            search_trapezoid_index(v, node->left)  :
            search_trapezoid_index(v, node->right) ;
    }

    case SINK: {
      return node->key_index;
    }
  }

  return kInvalidIndex;
}